

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TryExpr::TryExpr(TryExpr *this,Location *loc)

{
  Location *loc_local;
  TryExpr *this_local;
  
  ExprMixin<(wabt::ExprType)60>::ExprMixin((ExprMixin<(wabt::ExprType)60> *)this,loc);
  *(undefined ***)this = &PTR__TryExpr_003fa620;
  this->kind = Plain;
  Block::Block(&this->block);
  std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::vector(&this->catches);
  Var::Var(&this->delegate_target);
  return;
}

Assistant:

explicit TryExpr(const Location& loc = Location())
      : ExprMixin<ExprType::Try>(loc), kind(TryKind::Plain) {}